

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall
ImGuiTextFilter::TextRange::split
          (TextRange *this,char separator,ImVector<ImGuiTextFilter::TextRange> *out)

{
  int *piVar1;
  int iVar2;
  TextRange *pTVar3;
  TextRange *pTVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  
  iVar2 = out->Capacity;
  if (iVar2 < 0) {
    uVar5 = iVar2 / 2 + iVar2;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pTVar4 = (TextRange *)(*GImAllocatorAllocFunc)(uVar8 << 4,GImAllocatorUserData);
    if (out->Data != (TextRange *)0x0) {
      memcpy(pTVar4,out->Data,(long)out->Size << 4);
      pTVar3 = out->Data;
      if ((pTVar3 != (TextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pTVar3,GImAllocatorUserData);
    }
    out->Data = pTVar4;
    out->Capacity = (int)uVar8;
  }
  out->Size = 0;
  pcVar9 = this->b;
  pcVar10 = pcVar9;
  if (pcVar9 < this->e) {
    do {
      if (*pcVar9 == separator) {
        iVar2 = out->Capacity;
        if (out->Size == iVar2) {
          if (iVar2 == 0) {
            iVar6 = 8;
          }
          else {
            iVar6 = iVar2 / 2 + iVar2;
          }
          iVar7 = out->Size + 1;
          if (iVar7 < iVar6) {
            iVar7 = iVar6;
          }
          if (iVar2 < iVar7) {
            if (GImGui != (ImGuiContext *)0x0) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + 1;
            }
            pTVar4 = (TextRange *)(*GImAllocatorAllocFunc)((long)iVar7 << 4,GImAllocatorUserData);
            if (out->Data != (TextRange *)0x0) {
              memcpy(pTVar4,out->Data,(long)out->Size << 4);
              pTVar3 = out->Data;
              if ((pTVar3 != (TextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar1 = *piVar1 + -1;
              }
              (*GImAllocatorFreeFunc)(pTVar3,GImAllocatorUserData);
            }
            out->Data = pTVar4;
            out->Capacity = iVar7;
          }
        }
        pTVar4 = out->Data;
        iVar2 = out->Size;
        pTVar4[iVar2].b = pcVar10;
        pTVar4[iVar2].e = pcVar9;
        out->Size = out->Size + 1;
        pcVar10 = pcVar9 + 1;
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 < this->e);
  }
  if (pcVar10 != pcVar9) {
    iVar2 = out->Capacity;
    if (out->Size == iVar2) {
      iVar6 = out->Size + 1;
      if (iVar2 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar2 / 2 + iVar2;
      }
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar2 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pTVar4 = (TextRange *)(*GImAllocatorAllocFunc)((long)iVar6 << 4,GImAllocatorUserData);
        if (out->Data != (TextRange *)0x0) {
          memcpy(pTVar4,out->Data,(long)out->Size << 4);
          pTVar3 = out->Data;
          if ((pTVar3 != (TextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pTVar3,GImAllocatorUserData);
        }
        out->Data = pTVar4;
        out->Capacity = iVar6;
      }
    }
    pTVar4 = out->Data;
    iVar2 = out->Size;
    pTVar4[iVar2].b = pcVar10;
    pTVar4[iVar2].e = pcVar9;
    out->Size = out->Size + 1;
  }
  return;
}

Assistant:

void ImGuiTextFilter::TextRange::split(char separator, ImVector<TextRange>* out) const
{
    out->resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out->push_back(TextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out->push_back(TextRange(wb, we));
}